

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_addref(HSQUIRRELVM v,HSQOBJECT *po)

{
  uint *in_RSI;
  SQObject *in_RDI;
  RefTable *unaff_retaddr;
  
  if ((*in_RSI & 0x8000000) != 0) {
    RefTable::AddRef(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void sq_addref(HSQUIRRELVM v,HSQOBJECT *po)
{
    if(!ISREFCOUNTED(type(*po))) return;
#ifdef NO_GARBAGE_COLLECTOR
    __AddRef(po->_type,po->_unVal);
#else
    _ss(v)->_refs_table.AddRef(*po);
#endif
}